

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnReturnCallIndirect
          (SharedValidator *this,Location *loc,Var *sig_var,Var *table_var)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  FuncType func_type;
  FuncType local_e8;
  Var local_b8;
  Var local_70;
  
  this->expr_loc_ = loc;
  Var::Var(&local_70,table_var);
  RVar1 = CheckTableIndex(this,&local_70,(TableType *)0x0);
  Var::~Var(&local_70);
  local_e8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Var::Var(&local_b8,sig_var);
  RVar2 = CheckFuncTypeIndex(this,&local_b8,&local_e8);
  Var::~Var(&local_b8);
  RVar3 = TypeChecker::OnReturnCallIndirect(&this->typechecker_,&local_e8.params,&local_e8.results);
  FuncType::~FuncType(&local_e8);
  return (Result)(uint)(RVar3.enum_ == Error || (RVar2.enum_ == Error || RVar1.enum_ == Error));
}

Assistant:

Result SharedValidator::OnReturnCallIndirect(const Location& loc,
                                             Var sig_var,
                                             Var table_var) {
  Result result = Result::Ok;
  expr_loc_ = &loc;
  result |= CheckTableIndex(table_var);
  FuncType func_type;
  result |= CheckFuncTypeIndex(sig_var, &func_type);
  result |=
      typechecker_.OnReturnCallIndirect(func_type.params, func_type.results);
  return result;
}